

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O0

SpatialVector * __thiscall
RigidBodyDynamics::Math::SpatialTransform::applyAdjoint(SpatialTransform *this,SpatialVector *f_sp)

{
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *other;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this_01;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other_00;
  Scalar *pSVar1;
  CoeffReturnType pdVar2;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_RSI;
  SpatialVector *in_RDI;
  double *v0;
  Vector3d En_rxf;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
  *in_stack_fffffffffffffe58;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *in_stack_fffffffffffffe60;
  double *in_stack_fffffffffffffe98;
  double *in_stack_fffffffffffffea0;
  double *in_stack_fffffffffffffea8;
  Vector3_t *in_stack_fffffffffffffeb0;
  double *v4;
  double *v3;
  double *v2;
  double *v1;
  SpatialVector_t *this_02;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffef0;
  double *v5;
  
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
  other = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                       (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
  Vector3_t::Vector3_t
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
             in_stack_fffffffffffffe98);
  this_00 = in_RSI + 0x48;
  this_01 = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
            Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                      (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
  other_00 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                       (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
  Vector3_t::Vector3_t
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
             in_stack_fffffffffffffe98);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (in_RSI,in_stack_fffffffffffffef0);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-(this_00,other_00);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*(this_01,other);
  Vector3_t::
  Vector3_t<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
            ((Vector3_t *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)in_stack_fffffffffffffe60,
             (Index)in_stack_fffffffffffffe58);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)in_stack_fffffffffffffe60,
             (Index)in_stack_fffffffffffffe58);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)in_stack_fffffffffffffe60,
             (Index)in_stack_fffffffffffffe58);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_stack_fffffffffffffe60,
             (Index)in_stack_fffffffffffffe58,0x6bee90);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_stack_fffffffffffffe60,
             (Index)in_stack_fffffffffffffe58,0x6beecc);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_stack_fffffffffffffe60,
             (Index)in_stack_fffffffffffffe58,0x6bef22);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                      in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58,0x6bef75);
  v3 = (double *)*pSVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
  v2 = (double *)*pdVar2;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                      in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58,0x6befb0);
  v4 = (double *)*pSVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
  v0 = (double *)((double)v3 * (double)v2 + (double)v4 * *pdVar2);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                      in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58,0x6bf00a);
  v1 = (double *)*pSVar1;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_stack_fffffffffffffe60,
             (Index)in_stack_fffffffffffffe58,0x6bf060);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
  v5 = (double *)*pdVar2;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                      in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58,0x6bf0a3);
  this_02 = (SpatialVector_t *)*pSVar1;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)in_stack_fffffffffffffe60,
             (Index)in_stack_fffffffffffffe58,0x6bf107);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
            (in_stack_fffffffffffffe60,(Index)in_stack_fffffffffffffe58);
  SpatialVector_t::SpatialVector_t(this_02,v0,v1,v2,v3,v4,v5);
  return in_RDI;
}

Assistant:

SpatialVector applyAdjoint (const SpatialVector &f_sp) {
    Vector3d En_rxf = E * (Vector3d (f_sp[0], f_sp[1], f_sp[2]) - r.cross(Vector3d (f_sp[3], f_sp[4], f_sp[5])));
    //		Vector3d En_rxf = E * (Vector3d (f_sp[0], f_sp[1], f_sp[2]) - r.cross(Eigen::Map<Vector3d> (&(f_sp[3]))));

    return SpatialVector (
        En_rxf[0],
        En_rxf[1],
        En_rxf[2],
        E(0,0) * f_sp[3] + E(0,1) * f_sp[4] + E(0,2) * f_sp[5],
        E(1,0) * f_sp[3] + E(1,1) * f_sp[4] + E(1,2) * f_sp[5],
        E(2,0) * f_sp[3] + E(2,1) * f_sp[4] + E(2,2) * f_sp[5]
        );
  }